

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O2

void check_ansv<unsigned_long,2>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,bool left,size_t nonsv)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  range_end;
  size_t sVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  Message *pMVar6;
  undefined7 in_register_00000011;
  AssertionResult *pAVar7;
  pointer puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char *pcVar10;
  char *in_R9;
  bool bVar11;
  size_t s;
  AssertionResult local_108;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  unsigned_long m;
  char local_b9;
  AssertHelper local_b8;
  undefined4 local_ac;
  AssertHelper local_a8;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  minquery;
  
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::rmq(&minquery,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish,0x100,8);
  local_ac = (undefined4)CONCAT71(in_register_00000011,left);
  local_b9 = !left;
  local_108.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  do {
    _Var5._M_current =
         (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start;
    range_end._M_current =
         (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)range_end._M_current - (long)_Var5._M_current >> 3);
    if (pbVar9 <= local_108.message_.ptr_) {
      rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      ::~rmq(&minquery);
      return;
    }
    sVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)local_108.message_.ptr_];
    if (sVar1 == nonsv) {
      if (local_108.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
          local_b9 == '\0') {
        _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                ::query(&minquery,_Var5,
                        _Var5._M_current +
                        (long)((long)&((local_108.message_.ptr_)->_M_dataplus)._M_p + 1));
        uVar2 = *_Var5._M_current;
        puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar3[(long)local_108.message_.ptr_] == uVar2) {
          gtest_ar_.success_ = true;
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ = *puVar3 == uVar2;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&s);
            std::operator<<((ostream *)(s + 0x10)," at i=");
            std::ostream::_M_insert<unsigned_long>(s + 0x10);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"in[i] == m || in[0] == m","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&m,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x29,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&s);
LAB_00135134:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&s);
          }
        }
LAB_0013514e:
        pAVar7 = &gtest_ar_;
        goto LAB_00135c24;
      }
      if (((char)local_ac == '\0') &&
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&((local_108.message_.ptr_)->_M_dataplus)._M_p + 1U) < pbVar9)) {
        _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                ::query(&minquery,_Var5._M_current + (long)local_108.message_.ptr_,range_end);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar11 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[(long)local_108.message_.ptr_] ==
                 *_Var5._M_current;
        gtest_ar_.success_ = bVar11;
        if (!bVar11) {
          testing::Message::Message((Message *)&s);
          std::operator<<((ostream *)(s + 0x10)," at i=");
          std::ostream::_M_insert<unsigned_long>(s + 0x10);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"in[i] == m",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x2c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&s);
          goto LAB_00135134;
        }
        goto LAB_0013514e;
      }
    }
    else {
      s = sVar1;
      if ((char)local_ac == '\0') {
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"s","i",&s,(unsigned_long *)&local_108.message_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar10 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x57,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_108.message_.ptr_ <
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(s - 1)) {
          _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                  ::query(&minquery,
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(puVar8 + (long)((long)&((local_108.message_.ptr_)->_M_dataplus)._M_p +
                                            1)),
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(puVar8 + s));
          m = *_Var5._M_current;
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (m < puVar8[(long)local_108.message_.ptr_]) {
            gtest_ar_._0_8_ = (ulong)(uint7)gtest_ar_._1_7_ << 8;
LAB_0013546a:
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            testing::Message::Message((Message *)&local_108);
            std::operator<<((ostream *)(local_108._0_8_ + 0x10)," for range [");
            std::ostream::_M_insert<unsigned_long>(local_108._0_8_ + 0x10);
            std::operator<<((ostream *)(local_108._0_8_ + 0x10),",");
            std::ostream::_M_insert<unsigned_long>(local_108._0_8_ + 0x10);
            std::operator<<((ostream *)(local_108._0_8_ + 0x10),"]");
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x5e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_b8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_108);
          }
          else {
            uVar4 = puVar8[s];
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar_.success_ = uVar4 <= m;
            if (m < uVar4) goto LAB_0013546a;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = puVar8 + (long)local_108.message_.ptr_;
          if (*puVar3 == puVar8[s]) {
            sVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Vector_impl_data._M_start[s];
            if (sVar1 != nonsv) {
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)&gtest_ar,"in[nsv[s]]","in[i]",puVar8 + sVar1,puVar3);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," for i=");
                std::ostream::_M_insert<unsigned_long>(gtest_ar_._0_8_ + 0x10);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", in[i]=");
                pMVar6 = testing::Message::operator<<
                                   ((Message *)&gtest_ar_,
                                    (in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                    (long)local_108.message_.ptr_);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [9])", in[s]=");
                pMVar6 = testing::Message::operator<<
                                   (pMVar6,(in->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start + s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [4])",s=");
                pMVar6 = testing::Message::operator<<(pMVar6,&s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [10])", nsv[s]=");
                pMVar6 = testing::Message::operator<<
                                   (pMVar6,(nsv->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start + s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [13])", in.size()=");
                local_108._0_8_ =
                     (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3;
                pMVar6 = testing::Message::operator<<(pMVar6,(unsigned_long *)&local_108);
                pcVar10 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,100,pcVar10);
                testing::internal::AssertHelper::operator=(&local_b8,pMVar6);
                testing::internal::AssertHelper::~AssertHelper(&local_b8);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              uVar4 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[s];
              if (s + 1 < uVar4) {
                puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                        ::query(&minquery,
                                (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 )(puVar8 + s + 1),
                                (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 )(puVar8 + uVar4));
                gtest_ar_._0_8_ = *_Var5._M_current;
                testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                          ((internal *)&gtest_ar,"m2","in[i]",(unsigned_long *)&gtest_ar_,
                           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + (long)local_108.message_.ptr_)
                ;
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_108);
                  std::operator<<((ostream *)(local_108._0_8_ + 0x10)," for i=");
                  std::ostream::_M_insert<unsigned_long>(local_108._0_8_ + 0x10);
                  std::operator<<((ostream *)(local_108._0_8_ + 0x10),", in[i]=");
                  pMVar6 = testing::Message::operator<<
                                     ((Message *)&local_108,
                                      (in->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                      (long)local_108.message_.ptr_);
                  pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [9])", in[s]=");
                  pMVar6 = testing::Message::operator<<
                                     (pMVar6,(in->
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             )._M_impl.super__Vector_impl_data._M_start + s);
                  pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [4])",s=");
                  pMVar6 = testing::Message::operator<<(pMVar6,&s);
                  pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [10])", nsv[s]=");
                  pMVar6 = testing::Message::operator<<
                                     (pMVar6,(nsv->
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             )._M_impl.super__Vector_impl_data._M_start + s);
                  pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [13])", in.size()=");
                  local_b8.data_ =
                       (AssertHelperData *)
                       ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3);
                  pMVar6 = testing::Message::operator<<(pMVar6,(unsigned_long *)&local_b8);
                  pcVar10 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,0x67,pcVar10);
                  testing::internal::AssertHelper::operator=(&local_a8,pMVar6);
                  testing::internal::AssertHelper::~AssertHelper(&local_a8);
                  pAVar7 = &local_108;
                  goto LAB_00135b8a;
                }
                goto LAB_00135b8f;
              }
            }
          }
          else {
            testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                      ((internal *)&gtest_ar,"in[i]","m",puVar3,&m);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," for i=");
              std::ostream::_M_insert<unsigned_long>(gtest_ar_._0_8_ + 0x10);
              std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", in[i]=");
              pMVar6 = testing::Message::operator<<
                                 ((Message *)&gtest_ar_,
                                  (in->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                  (long)local_108.message_.ptr_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [9])", in[s]=");
              pMVar6 = testing::Message::operator<<
                                 (pMVar6,(in->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start + s);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [4])",s=");
              pMVar6 = testing::Message::operator<<(pMVar6,&s);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [10])", nsv[s]=");
              pMVar6 = testing::Message::operator<<
                                 (pMVar6,(nsv->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start + s);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [13])", in.size()=");
              local_108._0_8_ =
                   (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3;
              pMVar6 = testing::Message::operator<<(pMVar6,(unsigned_long *)&local_108);
              pcVar10 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x6d,pcVar10);
              testing::internal::AssertHelper::operator=(&local_b8,pMVar6);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              pAVar7 = &gtest_ar_;
LAB_00135b8a:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)pAVar7);
            }
LAB_00135b8f:
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
          }
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"in[s]","in[i]",puVar8 + s,
                   puVar8 + (long)local_108.message_.ptr_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar10 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x77,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&gtest_ar_);
          goto LAB_00135c0f;
        }
      }
      else {
        testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"s","i",&s,(unsigned_long *)&local_108.message_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar10 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x31,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(s + 1) <
            local_108.message_.ptr_) {
          _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                  ::query(&minquery,
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(puVar8 + s + 1),
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(puVar8 + (long)local_108.message_.ptr_));
          m = *_Var5._M_current;
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (m < puVar8[(long)local_108.message_.ptr_]) {
            gtest_ar_._0_8_ = (ulong)(uint7)gtest_ar_._1_7_ << 8;
LAB_00135171:
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            testing::Message::Message((Message *)&local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x3a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_b8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_108);
          }
          else {
            uVar4 = puVar8[s];
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar_.success_ = uVar4 <= m;
            if (m < uVar4) goto LAB_00135171;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = puVar8 + (long)local_108.message_.ptr_;
          if (*puVar3 == puVar8[s]) {
            sVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Vector_impl_data._M_start[s];
            if (sVar1 != nonsv) {
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)&gtest_ar,"in[nsv[s]]","in[i]",puVar8 + sVar1,puVar3);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," for i=");
                std::ostream::_M_insert<unsigned_long>(gtest_ar_._0_8_ + 0x10);
                std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", in[i]=");
                pMVar6 = testing::Message::operator<<
                                   ((Message *)&gtest_ar_,
                                    (in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                    (long)local_108.message_.ptr_);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [9])", in[s]=");
                pMVar6 = testing::Message::operator<<
                                   (pMVar6,(in->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start + s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [4])",s=");
                pMVar6 = testing::Message::operator<<(pMVar6,&s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [10])", nsv[s]=");
                pMVar6 = testing::Message::operator<<
                                   (pMVar6,(nsv->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start + s);
                pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [13])", in.size()=");
                local_108._0_8_ =
                     (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3;
                pMVar6 = testing::Message::operator<<(pMVar6,(unsigned_long *)&local_108);
                pcVar10 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,0x41,pcVar10);
                testing::internal::AssertHelper::operator=(&local_b8,pMVar6);
                testing::internal::AssertHelper::~AssertHelper(&local_b8);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              uVar2 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[s];
              if (uVar2 + 1 < s) {
                puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                _Var5 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                        ::query(&minquery,
                                (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 )(puVar8 + uVar2 + 1),
                                (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 )(puVar8 + s));
                gtest_ar_._0_8_ = *_Var5._M_current;
                testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                          ((internal *)&gtest_ar,"m2","in[i]",(unsigned_long *)&gtest_ar_,
                           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + (long)local_108.message_.ptr_)
                ;
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_108);
                  pcVar10 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_b8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,0x44,pcVar10);
                  testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_108);
                  testing::internal::AssertHelper::~AssertHelper(&local_b8);
                  pAVar7 = &local_108;
                  goto LAB_0013599f;
                }
                goto LAB_001359a4;
              }
            }
          }
          else {
            testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                      ((internal *)&gtest_ar,"in[i]","m",puVar3,&m);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10)," for i=");
              std::ostream::_M_insert<unsigned_long>(gtest_ar_._0_8_ + 0x10);
              std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", in[i]=");
              pMVar6 = testing::Message::operator<<
                                 ((Message *)&gtest_ar_,
                                  (in->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                  (long)local_108.message_.ptr_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [9])", in[s]=");
              pMVar6 = testing::Message::operator<<
                                 (pMVar6,(in->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start + s);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [4])",s=");
              pMVar6 = testing::Message::operator<<(pMVar6,&s);
              pcVar10 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x49,pcVar10);
              testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,pMVar6);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              pAVar7 = &gtest_ar_;
LAB_0013599f:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)pAVar7);
            }
LAB_001359a4:
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
          }
          puVar8 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"in[s]","in[i]",puVar8 + s,
                   puVar8 + (long)local_108.message_.ptr_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar10 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x53,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m,(Message *)&gtest_ar_);
LAB_00135c0f:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
      }
      pAVar7 = &gtest_ar;
LAB_00135c24:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&pAVar7->message_);
    }
    local_108.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&((local_108.message_.ptr_)->_M_dataplus)._M_p + 1);
  } while( true );
}

Assistant:

void check_ansv(const std::vector<T>& in, const std::vector<size_t>& nsv, bool left, size_t nonsv) {
    // construct RMQ
    rmq<typename std::vector<T>::const_iterator> minquery(in.cbegin(), in.cend());

    // for each position check the nsv and direction
    for (size_t i = 0; i < in.size(); ++i) {
        if (nsv[i] == nonsv) {
            if (left && i > 0) {
                // expect this is an overall minimum of the range [0, i]
                T m = *minquery.query(in.cbegin(), in.cbegin()+i+1);
                EXPECT_TRUE(in[i] == m || in[0] == m) << " at i=" << i;
            } else if (!left && i+1 < in.size()) {
                T m = *minquery.query(in.cbegin()+i, in.cend());
                EXPECT_TRUE(in[i] == m) << " at i=" << i;
            }
        } else {
            size_t s = nsv[i];
            if (left) {
                EXPECT_LT(s, i);
                // no other element can be smaller than `in[i]` after `in[s]`
                if (s+1 < i) {
                    T m = *minquery.query(in.cbegin()+s+1, in.cbegin()+i);
                    if (type == nearest_sm) {
                        // check that there is nothing smaller than in[i] in the range
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << s+1 << "," << i << "]";
                    } else if (type == furthest_eq) {
                        // test that no smaller values lay in between
                        EXPECT_TRUE(in[i] <= m && in[s] <= m);

                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (nsv[s]+1 < s) {
                                    T m2 = *minquery.query(in.cbegin()+nsv[s]+1, in.cbegin()+s);
                                    EXPECT_GT(m2, in[i]);
                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s;
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m);
                    }
                }
                // element at `s` is smaller than `in[i]`
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }

            } else {
                EXPECT_GT(s, i);
                // no other element can be smaller than `in[i]` before `in[s]`
                if (i < s-1) {
                    T m = *minquery.query(in.cbegin()+i+1, in.cbegin()+s);
                    if (type == nearest_sm) {
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    } else if (type == furthest_eq) {
                        EXPECT_TRUE(in[i] <= m && in[s] <= m) << " for range [" << i << "," << s-1 << "]";
                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (s+1 < nsv[s]) {
                                    T m2 = *minquery.query(in.cbegin()+s+1, in.cbegin()+nsv[s]);
                                    EXPECT_GT(m2, in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();

                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    }
                }
                // element at `s` is smaller than in[i]
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }
            }

        }
    }
}